

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

double s2polyline_alignment::BoundsCheckedTableCost
                 (int row,int col,ColumnStride *stride,CostTable *table)

{
  double dVar1;
  
  if ((col & row) < 0) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = 1.79769313486232e+308;
    if (((-1 < (col | row)) && (stride->start <= col)) && (col < stride->end)) {
      return *(double *)
              (*(long *)&(table->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(uint)row].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + (ulong)(uint)col * 8);
    }
  }
  return dVar1;
}

Assistant:

inline double BoundsCheckedTableCost(const int row, const int col,
                                     const ColumnStride& stride,
                                     const CostTable& table) {
  if (row < 0 && col < 0) {
    return 0.0;
  } else if (row < 0 || col < 0 || !stride.InRange(col)) {
    return DOUBLE_MAX;
  } else {
    return table[row][col];
  }
}